

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf_test.cpp
# Opt level: O0

void func_call_by_ptr_arr(size_t COUNT)

{
  uint32_t uVar1;
  char *pcVar2;
  ostream *poVar3;
  rep_conflict rVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double Mrps;
  double ns_per_op;
  duration<double,_std::ratio<1L,_1L>_> local_88;
  duration<double,_std::ratio<1L,_1L>_> diff;
  now_t stop;
  long lStack_70;
  uint32_t i_1;
  size_t res;
  now_t start;
  uint32_t i;
  f_t f [8];
  size_t COUNT_local;
  undefined4 uVar8;
  
  memcpy(&stack0xffffffffffffffa8,&PTR_f1_0010ad20,0x40);
  for (start.__d.__r._4_4_ = 0; start.__d.__r._4_4_ < COUNT;
      start.__d.__r._4_4_ = start.__d.__r._4_4_ + 1) {
    uVar1 = rand();
    arr[start.__d.__r._4_4_].value = uVar1;
  }
  res = (size_t)now();
  lStack_70 = 0;
  for (stop.__d.__r._4_4_ = 0; stop.__d.__r._4_4_ < COUNT;
      stop.__d.__r._4_4_ = stop.__d.__r._4_4_ + 1) {
    (**(code **)(&stack0xffffffffffffffa8 +
                (lStack_70 + (ulong)arr[stop.__d.__r._4_4_].value & 7) * 8))
              (&stack0xffffffffffffff90);
  }
  diff.__r = (rep_conflict)now();
  side_effect = side_effect + ((uint)lStack_70 & 1);
  ns_per_op = (double)std::chrono::operator-
                                ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&diff,(time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                           *)&res);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1l>> *)&local_88,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)&ns_per_op);
  rVar4 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_88);
  uVar8 = (undefined4)(COUNT >> 0x20);
  auVar7._8_4_ = uVar8;
  auVar7._0_8_ = COUNT;
  auVar7._12_4_ = 0x45300000;
  dVar5 = (rVar4 * 1000.0 * 1000.0 * 1000.0) /
          ((auVar7._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)COUNT) - 4503599627370496.0));
  auVar6._8_4_ = uVar8;
  auVar6._0_8_ = COUNT;
  auVar6._12_4_ = 0x45300000;
  rVar4 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_88);
  pcVar2 = expand_name("func_call_by_ptr_arr");
  poVar3 = std::operator<<((ostream *)&std::cout,pcVar2);
  poVar3 = std::operator<<(poVar3,": ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar5);
  poVar3 = std::operator<<(poVar3,"ns per operation,\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar5 / unit);
  poVar3 = std::operator<<(poVar3," ticks,\t");
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,((((auVar6._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)COUNT) - 4503599627370496.0)) /
                              rVar4) / 1000.0) / 1000.0);
  poVar3 = std::operator<<(poVar3," Mrps");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

static void __attribute__((noinline))
func_call_by_ptr_arr(const size_t COUNT = SIZE)
{
    f_t f[8] = {f1, f2, f3, f4, f5, f6, f7, f8};
    for (uint32_t i = 0; i < COUNT; i++)
    {
        arr[i].value = rand();
    }

    now_t start = now();
    size_t res = 0;
    for (uint32_t i = 0; i < COUNT; i++)
    {
        f[(res + arr[i].value) % 8](res);
    }
    now_t stop = now();
    side_effect += res % 2;

    std::chrono::duration<double> diff = stop - start;
    double ns_per_op = diff.count() * 1000 * 1000 * 1000 / COUNT;
    double Mrps = COUNT / diff.count() / 1000 / 1000;
    std::cout << NAME << ": " << ns_per_op << "ns per operation,\t"
              << (ns_per_op / unit) << " ticks,\t"
              << Mrps << " Mrps" << std::endl;
}